

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O1

void WriteDDintoBLIFfile(FILE *pFile,DdNode *Func,char *OutputName,char *Prefix,char **InputNames)

{
  FILE *pFVar1;
  st__generator *psVar2;
  st__generator *psVar3;
  int iVar4;
  st__table *visited;
  st__generator *psVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  DdNode *Node;
  FILE *local_60;
  char *local_58;
  st__generator *local_50;
  st__table *local_48;
  char **local_40;
  int *pSlot;
  
  local_60 = (FILE *)pFile;
  local_58 = Prefix;
  local_50 = (st__generator *)OutputName;
  local_40 = InputNames;
  visited = st__init_table(st__ptrcmp,st__ptrhash);
  cuddCollectNodes((DdNode *)((ulong)Func & 0xfffffffffffffffe),visited);
  local_48 = visited;
  psVar5 = st__init_gen(visited);
  iVar4 = st__gen(psVar5,(char **)&Node,(char **)0x0);
  uVar10 = 0;
  if (iVar4 != 0) {
    uVar10 = 0;
    do {
      uVar10 = uVar10 | (ulong)Node ^ (ulong)Func & 0xfffffffffffffffe;
      iVar4 = st__gen(psVar5,(char **)&Node,(char **)0x0);
    } while (iVar4 != 0);
  }
  st__free_gen(psVar5);
  pFVar1 = local_60;
  uVar9 = 0;
  do {
    uVar7 = ~(-1 << ((byte)uVar9 & 0x1f));
    if ((long)uVar10 <= (long)(ulong)uVar7) break;
    bVar11 = uVar9 < 0x3c;
    uVar9 = uVar9 + 4;
  } while (bVar11);
  fprintf(local_60,".names %s%lx %s\n",local_58,(ulong)(uVar7 & (uint)Func) / 0x28,local_50);
  pcVar6 = "0";
  if (((ulong)Func & 1) == 0) {
    pcVar6 = "1";
  }
  fprintf(pFVar1,"%s 1\n",pcVar6);
  psVar5 = st__init_gen(local_48);
  iVar4 = st__gen(psVar5,(char **)&Node,(char **)0x0);
  psVar3 = psVar5;
  pFVar1 = local_60;
  psVar2 = local_50;
  do {
    local_50 = psVar3;
    local_60 = pFVar1;
    if (iVar4 == 0) {
      local_50 = psVar2;
      st__free_gen(psVar5);
      st__free_table(local_48);
      return;
    }
    uVar9 = (uint)Node;
    if ((ulong)Node->index == 0x7fffffff) {
      fprintf(pFVar1,".names %s%lx\n",local_58,(ulong)(uVar9 & uVar7) / 0x28);
      pcVar6 = "0";
      if ((Node->type).value != 0.0) {
        pcVar6 = "1";
      }
      if (NAN((Node->type).value)) {
        pcVar6 = "1";
      }
      fprintf(pFVar1," %s\n",pcVar6);
    }
    else {
      if (local_40[Node->index] == (char *)0x0) {
        __assert_fail("InputNames[Node->index]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casCore.c"
                      ,0x376,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)");
      }
      pcVar6 = *(char **)((long)&Node->type + 8);
      uVar8 = (uint)*(undefined8 *)&Node->type;
      if (pcVar6 == (char *)((ulong)pcVar6 & 0xfffffffffffffffe)) {
        fprintf(pFVar1,".names %s %s%lx %s%lx %s%lx\n",local_40[Node->index],local_58,
                (ulong)((uint)pcVar6 & uVar7) / 0x28,local_58,(ulong)(uVar8 & uVar7) / 0x28,local_58
                ,(ulong)(uVar9 & uVar7) / 0x28);
        fwrite("01- 1\n",6,1,pFVar1);
        fwrite("1-1 1\n",6,1,pFVar1);
      }
      else {
        uVar10 = (ulong)((uint)pcVar6 & uVar7) / 0x28;
        fprintf(pFVar1,".names %s %s%lx_i %s%lx %s%lx\n",local_40[Node->index],local_58,uVar10,
                local_58,(ulong)(uVar8 & uVar7) / 0x28,local_58,(ulong)(uVar9 & uVar7) / 0x28);
        fwrite("01- 1\n",6,1,pFVar1);
        fwrite("1-1 1\n",6,1,pFVar1);
        iVar4 = st__find(local_48,(char *)((ulong)pcVar6 & 0xfffffffffffffffe),(char ***)&pSlot);
        pFVar1 = local_60;
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casCore.c"
                        ,0x38c,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)"
                       );
        }
        psVar5 = local_50;
        if (*pSlot == 0) {
          *pSlot = 1;
          fprintf(local_60,".names %s%lx %s%lx_i\n",local_58,uVar10,local_58,uVar10);
          fwrite("0 1\n",4,1,pFVar1);
          psVar5 = local_50;
        }
      }
    }
    iVar4 = st__gen(psVar5,(char **)&Node,(char **)0x0);
    psVar3 = local_50;
    pFVar1 = local_60;
    psVar2 = local_50;
  } while( true );
}

Assistant:

void WriteDDintoBLIFfile( FILE * pFile, DdNode * Func, char * OutputName, char * Prefix, char ** InputNames )
// writes the main part of the BLIF file 
// Func is a BDD or a 0-1 ADD to be written
// OutputName is the name of the output
// Prefix is attached to each intermendiate signal to make it unique
// InputNames are the names of the input signals
// (some part of the code is borrowed from Cudd_DumpDot())
{
    int i;
    st__table * visited;
    st__generator * gen = NULL;
    long refAddr, diff, mask;
    DdNode * Node, * Else, * ElseR, * Then;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash );

    /* Collect all the nodes of this DD in the symbol table. */
    cuddCollectNodes( Cudd_Regular(Func), visited );

    /* Find how many most significant hex digits are identical
       ** in the addresses of all the nodes. Build a mask based
       ** on this knowledge, so that digits that carry no information
       ** will not be printed. This is done in two steps.
       **  1. We scan the symbol table to find the bits that differ
       **     in at least 2 addresses.
       **  2. We choose one of the possible masks. There are 8 possible
       **     masks for 32-bit integer, and 16 possible masks for 64-bit
       **     integers.
     */

    /* Find the bits that are different. */
    refAddr = ( long )Cudd_Regular(Func);
    diff = 0;
    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        diff |= refAddr ^ ( long ) Node;
    }
    st__free_gen( gen );
    gen = NULL;

    /* Choose the mask. */
    for ( i = 0; ( unsigned ) i < 8 * sizeof( long ); i += 4 )
    {
        mask = ( 1 << i ) - 1;
        if ( diff <= mask )
            break;
    }


    // write the buffer for the output
    fprintf( pFile, ".names %s%lx %s\n", Prefix, ( mask & (long)Cudd_Regular(Func) ) / sizeof(DdNode), OutputName ); 
    fprintf( pFile, "%s 1\n", (Cudd_IsComplement(Func))? "0": "1" );


    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        if ( Node->index == CUDD_MAXINDEX )
        {
            // write the terminal node
            fprintf( pFile, ".names %s%lx\n", Prefix, ( mask & (long)Node ) / sizeof(DdNode) );
            fprintf( pFile, " %s\n", (cuddV(Node) == 0.0)? "0": "1" );
            continue;
        }

        Else  = cuddE(Node);
        ElseR = Cudd_Regular(Else);
        Then  = cuddT(Node);

        assert( InputNames[Node->index] );
        if ( Else == ElseR )
        { // no inverter
            fprintf( pFile, ".names %s %s%lx %s%lx %s%lx\n", InputNames[Node->index],                           
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );
        }
        else
        { // inverter
            int * pSlot;
            fprintf( pFile, ".names %s %s%lx_i %s%lx %s%lx\n", InputNames[Node->index],                         
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );

            // if the inverter is written, skip
            if ( ! st__find( visited, (char *)ElseR, (char ***)&pSlot ) )
                assert( 0 );
            if ( *pSlot )
                continue;
            *pSlot = 1;

            fprintf( pFile, ".names %s%lx %s%lx_i\n",  
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode)   );
            fprintf( pFile, "0 1\n" );
        }
    }
    st__free_gen( gen );
    gen = NULL;
    st__free_table( visited );
}